

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifold.h
# Opt level: O0

Segment * __thiscall
mnf::Manifold::getView<1>(Segment *__return_storage_ptr__,Manifold *this,RefVec *val,size_t i)

{
  int iVar1;
  undefined4 extraout_var;
  Index IVar2;
  Index IVar3;
  Index n;
  size_t i_local;
  RefVec *val_local;
  Manifold *this_local;
  
  iVar1 = (*this->_vptr_Manifold[7])();
  if (CONCAT44(extraout_var,iVar1) <= i) {
    __assert_fail("i < numberOfSubManifolds() && \"invalid index\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/include/manifolds/Manifold.h"
                  ,0x1a4,"Segment mnf::Manifold::getView(RefVec, size_t) const [D = 1]");
  }
  IVar2 = Eigen::
          EigenBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ::size((EigenBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                  *)val);
  IVar3 = getDim<1>(this);
  if (IVar2 != IVar3) {
    __assert_fail("val.size() == getDim<D>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/include/manifolds/Manifold.h"
                  ,0x1a5,"Segment mnf::Manifold::getView(RefVec, size_t) const [D = 1]");
  }
  IVar3 = getStart<1>(this,i);
  n = getDim<1>(this,i);
  Eigen::DenseBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>::
  segment<long>(__return_storage_ptr__,
                (DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 *)val,IVar3,n);
  return __return_storage_ptr__;
}

Assistant:

inline Segment Manifold::getView(RefVec val, size_t i) const
{
  mnf_assert(i < numberOfSubManifolds() && "invalid index");
  mnf_assert(val.size() == getDim<D>());
  return val.segment(getStart<D>(i), getDim<D>(i));
}